

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biasmultiply.cc
# Opt level: O1

duration<double,_std::ratio<1L,_1L>_>
testNew<intgemm::SSSE3::Kernels8>(Index A_rows,Index width,Index B_cols)

{
  UnquantizeAndAddBiasAndWrite callback;
  UnquantizeAndAddBiasAndWrite callback_00;
  float *pfVar1;
  size_t __i;
  long lVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  AlignedVector<float> bias;
  AlignedVector<float> B;
  AlignedVector<float> A;
  AlignedVector<signed_char> B_prep;
  AlignedVector<unsigned_char> A_prep;
  AlignedVector<float> test_C;
  mt19937 gen;
  AlignedVector<float> local_1448;
  AlignedVector<float> local_1438;
  AlignedVector<float> local_1428;
  AlignedVector<signed_char> local_1418;
  AlignedVector<unsigned_char> local_1408;
  AlignedVector<float> local_13f8;
  undefined4 local_13e8;
  undefined4 uStack_13e4;
  float *pfStack_13e0;
  float *local_13d8;
  undefined4 local_13d0;
  undefined4 uStack_13cc;
  float *pfStack_13c8;
  float *local_13c0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  intgemm::AlignedVector<float>::AlignedVector(&local_1428,(ulong)(width * A_rows),0x40);
  intgemm::AlignedVector<float>::AlignedVector(&local_1438,(ulong)(B_cols * width),0x40);
  intgemm::AlignedVector<float>::AlignedVector(&local_1448,(ulong)B_cols,0x40);
  pfVar1 = local_1428.mem_;
  local_13b8._M_x[0] = 0x1571;
  lVar2 = 1;
  uVar3 = 0x1571;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    local_13b8._M_x[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_13b8._M_p = 0x270;
  if (local_1428.size_ != 0) {
    lVar2 = local_1428.size_ << 2;
    lVar4 = 0;
    do {
      fVar5 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b8);
      *(float *)((long)pfVar1 + lVar4) = fVar5 + fVar5 + -1.0;
      lVar4 = lVar4 + 4;
    } while (lVar2 != lVar4);
  }
  pfVar1 = local_1438.mem_;
  if (local_1438.size_ != 0) {
    lVar2 = local_1438.size_ << 2;
    lVar4 = 0;
    do {
      fVar5 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b8);
      *(float *)((long)pfVar1 + lVar4) = fVar5 + fVar5 + -1.0;
      lVar4 = lVar4 + 4;
    } while (lVar2 != lVar4);
  }
  pfVar1 = local_1448.mem_;
  if (local_1448.size_ != 0) {
    lVar2 = 0;
    do {
      fVar5 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b8);
      *(float *)((long)pfVar1 + lVar2) = fVar5 + fVar5 + -1.0;
      lVar2 = lVar2 + 4;
    } while (local_1448.size_ << 2 != lVar2);
  }
  intgemm::AlignedVector<unsigned_char>::AlignedVector(&local_1408,local_1428.size_,0x40);
  intgemm::AlignedVector<signed_char>::AlignedVector(&local_1418,local_1438.size_,0x40);
  intgemm::SSSE3::Kernels8::PrepareA(local_1428.mem_,local_1408.mem_,63.5,A_rows,width);
  intgemm::SSSE3::Kernels8::PrepareB(local_1438.mem_,local_1418.mem_,63.5,width,B_cols);
  intgemm::AlignedVector<float>::AlignedVector(&local_13f8,(ulong)(B_cols * A_rows),0x40);
  local_13d0 = 0xbd010204;
  pfStack_13c8 = local_1448.mem_;
  local_13c0 = local_1448.mem_;
  callback._4_4_ = uStack_13cc;
  callback.unquant_mult = -0.031496063;
  callback.bias_addr = local_1448.mem_;
  callback.output_addr = local_1448.mem_;
  intgemm::SSSE3::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (local_1418.mem_,width,B_cols,callback);
  lVar2 = std::chrono::_V2::system_clock::now();
  local_13e8 = 0x39820610;
  pfStack_13e0 = local_1448.mem_;
  local_13d8 = local_13f8.mem_;
  callback_00._4_4_ = uStack_13e4;
  callback_00.unquant_mult = 0.0002480005;
  callback_00.bias_addr = local_1448.mem_;
  callback_00.output_addr = local_13f8.mem_;
  intgemm::SSSE3::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (local_1408.mem_,local_1418.mem_,A_rows,width,B_cols,callback_00);
  lVar4 = std::chrono::_V2::system_clock::now();
  free(local_13f8.mem_);
  free(local_1418.mem_);
  free(local_1408.mem_);
  free(local_1448.mem_);
  free(local_1438.mem_);
  free(local_1428.mem_);
  return (duration<double,_std::ratio<1L,_1L>_>)((double)(lVar4 - lVar2) / 1000000000.0);
}

Assistant:

std::chrono::duration<double> testNew(Index A_rows, Index width, Index B_cols) {
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  float unquant_mult_forprep = (-1)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  auto start = std::chrono::system_clock::now();
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));
  auto end = std::chrono::system_clock::now();

  std::chrono::duration<double> elapsed_seconds = end-start;
  return elapsed_seconds;

}